

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

Enum * __thiscall
kratos::Context::enum_
          (Context *this,string *enum_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *definition,uint32_t width)

{
  element_type *peVar1;
  bool *pbVar2;
  undefined1 local_38 [8];
  shared_ptr<kratos::Enum> p;
  uint32_t width_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *definition_local;
  string *enum_name_local;
  Context *this_local;
  
  p.super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = width;
  Enum::verify_naming_conflict(&this->enum_defs_,enum_name,definition);
  std::
  make_shared<kratos::Enum,std::__cxx11::string_const&,std::map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,unsigned_int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)enum_name,(uint *)definition);
  std::
  map<std::__cxx11::string,std::shared_ptr<kratos::Enum>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Enum>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::Enum>&>
            ((map<std::__cxx11::string,std::shared_ptr<kratos::Enum>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Enum>>>>
              *)&this->enum_defs_,enum_name,(shared_ptr<kratos::Enum> *)local_38);
  peVar1 = std::__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_38);
  pbVar2 = Enum::local(peVar1);
  *pbVar2 = false;
  peVar1 = std::__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_38);
  std::shared_ptr<kratos::Enum>::~shared_ptr((shared_ptr<kratos::Enum> *)local_38);
  return peVar1;
}

Assistant:

Enum &Context::enum_(const std::string &enum_name,
                     const std::map<std::string, uint64_t> &definition, uint32_t width) {
    Enum::verify_naming_conflict(enum_defs_, enum_name, definition);
    auto p = std::make_shared<Enum>(enum_name, definition, width);
    enum_defs_.emplace(enum_name, p);
    p->local() = false;
    return *p;
}